

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::EnumValueDescriptorProto::InternalSerializeWithCachedSizesToArray
          (EnumValueDescriptorProto *this,bool deterministic,uint8 *target)

{
  string *psVar1;
  EnumValueOptions *this_00;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  byte *pbVar5;
  uint8 *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar7 = (this->_has_bits_).has_bits_[0];
  if ((uVar7 & 1) != 0) {
    psVar1 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,SERIALIZE,
               "google.protobuf.EnumValueDescriptorProto.name");
    psVar1 = (this->name_).ptr_;
    *target = '\n';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar1,target + 1);
  }
  if ((uVar7 & 4) != 0) {
    uVar8 = (ulong)this->number_;
    pbVar5 = target + 1;
    *target = 0x10;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar5 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar9;
    target = pbVar5 + 1;
  }
  if ((uVar7 & 2) != 0) {
    this_00 = this->options_;
    *target = 0x1a;
    pbVar5 = target + 1;
    uVar7 = this_00->_cached_size_;
    uVar4 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar5 = (byte)uVar7 | 0x80;
        uVar4 = uVar7 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar4;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar4;
    target = EnumValueOptions::InternalSerializeWithCachedSizesToArray
                       (this_00,deterministic,pbVar5 + 1);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar6 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
    return puVar6;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* EnumValueDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumValueDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumValueDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional int32 number = 2;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->number(), target);
  }

  // optional .google.protobuf.EnumValueOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->options_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumValueDescriptorProto)
  return target;
}